

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  value_type vVar1;
  TestSuite *pTVar2;
  reference pvVar3;
  long in_RDI;
  size_t i;
  TestSuite *pTVar4;
  TestSuite *this_00;
  
  pTVar4 = (TestSuite *)0x0;
  while( true ) {
    this_00 = pTVar4;
    pTVar2 = (TestSuite *)
             std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size
                       ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                        (in_RDI + 0xb8));
    if (pTVar2 <= pTVar4) break;
    std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::operator[]
              ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
               (in_RDI + 0xb8),(size_type)this_00);
    TestSuite::UnshuffleTests(this_00);
    vVar1 = (value_type)this_00;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x108),(size_type)this_00);
    *pvVar3 = vVar1;
    pTVar4 = (TestSuite *)((long)&this_00->_vptr_TestSuite + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_suites_.size(); i++) {
    // Unshuffles the tests in each test suite.
    test_suites_[i]->UnshuffleTests();
    // Resets the index of each test suite.
    test_suite_indices_[i] = static_cast<int>(i);
  }
}